

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O3

bool __thiscall gl4cts::GetTextureSubImage::Errors::testExistingTextureObjectError(Errors *this)

{
  char cVar1;
  int iVar2;
  int value;
  undefined4 extraout_var;
  char *pcVar4;
  size_t sVar5;
  GLuint GVar6;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar3;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  GVar6 = this->m_texture_2D_multisampled;
  do {
    GVar6 = GVar6 + 1;
    cVar1 = (**(code **)(lVar3 + 0xcc8))(GVar6);
  } while (cVar1 != '\0');
  (*this->m_gl_GetTextureSubImage)
            (GVar6,0,0,0,0,2,2,1,0x1908,0x1401,0x10,this->m_destination_buffer);
  iVar2 = (**(code **)(lVar3 + 0x800))();
  if (iVar2 != 0x501) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if texture is not the name of an existing texture object (OpenGL 4.5 Core Specification chapter 8.11.4)."
               ,0xb3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," However, the error value ",0x1a);
    pcVar4 = glu::getErrorName(iVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was generated.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_gl_GetCompressedTextureSubImage)(GVar6,0,0,0,0,4,4,1,0x10,this->m_destination_buffer);
  value = (**(code **)(lVar3 + 0x800))();
  if (value != 0x501) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if texture is not the name of an existing texture object (OpenGL 4.5 Core Specification chapter 8.11.4)."
               ,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," However, the error value ",0x1a);
    pcVar4 = glu::getErrorName(value);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was generated.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return iVar2 == 0x501 && value == 0x501;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testExistingTextureObjectError()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare invalid texture name. */
	glw::GLuint invalid_texture = m_texture_2D_multisampled;

	while (gl.isTexture(++invalid_texture))
		;

	m_gl_GetTextureSubImage(invalid_texture, 0, 0, 0, 0, s_texture_data_width, s_texture_data_height, 1, GL_RGBA,
							GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_INVALID_VALUE error is expected to be generated by "
													   "glGetTextureSubImage if texture is not the name of an existing "
													   "texture object (OpenGL 4.5 Core Specification chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	m_gl_GetCompressedTextureSubImage(invalid_texture, 0, 0, 0, 0, s_texture_data_compressed_width,
									  s_texture_data_compressed_height, 1, s_destination_buffer_size,
									  m_destination_buffer);

	error_value = gl.getError();

	glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error_compressed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if "
							  "texture is not the name of an existing texture object (OpenGL 4.5 Core Specification "
							  "chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	if (is_proper_error && is_proper_error_compressed)
	{
		return true;
	}

	return false;
}